

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

int map_resize(map_base_t *m,int nbuckets,char *alloc_category)

{
  map_node_t *pmVar1;
  int iVar2;
  map_node_t **ppmVar3;
  uint uVar4;
  uint local_44;
  int i;
  map_node_t **buckets;
  map_node_t *next;
  map_node_t *node;
  map_node_t *nodes;
  char *alloc_category_local;
  int nbuckets_local;
  map_base_t *m_local;
  
  node = (map_node_t *)0x0;
  local_44 = m->nbuckets;
  while (uVar4 = local_44 - 1, local_44 != 0) {
    next = m->buckets[(int)uVar4];
    while (local_44 = uVar4, next != (map_node_t *)0x0) {
      pmVar1 = next->next;
      next->next = node;
      node = next;
      next = pmVar1;
    }
  }
  ppmVar3 = (map_node_t **)golf_realloc_tracked(m->buckets,(long)nbuckets << 3,alloc_category);
  if (ppmVar3 != (map_node_t **)0x0) {
    m->buckets = ppmVar3;
    m->nbuckets = nbuckets;
  }
  if (m->buckets != (map_node_t **)0x0) {
    memset(m->buckets,0,(ulong)m->nbuckets << 3);
    next = node;
    while (next != (map_node_t *)0x0) {
      pmVar1 = next->next;
      map_addnode(m,next);
      next = pmVar1;
    }
  }
  iVar2 = 0;
  if (ppmVar3 == (map_node_t **)0x0) {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int map_resize(map_base_t *m, int nbuckets, const char *alloc_category) {
  map_node_t *nodes, *node, *next;
  map_node_t **buckets;
  int i; 
  /* Chain all nodes together */
  nodes = NULL;
  i = m->nbuckets;
  while (i--) {
    node = (m->buckets)[i];
    while (node) {
      next = node->next;
      node->next = nodes;
      nodes = node;
      node = next;
    }
  }
  /* Reset buckets */
  buckets = golf_realloc_tracked(m->buckets, sizeof(*m->buckets) * nbuckets, alloc_category);
  if (buckets != NULL) {
    m->buckets = buckets;
    m->nbuckets = nbuckets;
  }
  if (m->buckets) {
    memset(m->buckets, 0, sizeof(*m->buckets) * m->nbuckets);
    /* Re-add nodes to buckets */
    node = nodes;
    while (node) {
      next = node->next;
      map_addnode(m, node);
      node = next;
    }
  }
  /* Return error code if realloc() failed */
  return (buckets == NULL) ? -1 : 0;
}